

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O2

QModelIndex * __thiscall
QConcatenateTablesProxyModel::mapFromSource
          (QModelIndex *__return_storage_ptr__,QConcatenateTablesProxyModel *this,
          QModelIndex *sourceIndex)

{
  int iVar1;
  QConcatenateTablesProxyModelPrivate *this_00;
  QAbstractItemModel *m;
  quintptr qVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QConcatenateTablesProxyModelPrivate **)(this + 8);
  bVar3 = QModelIndex::isValid(sourceIndex);
  if (bVar3) {
    m = (sourceIndex->m).ptr;
    bVar3 = QConcatenateTablesProxyModelPrivate::containsSourceModel(this_00,m);
    if (bVar3) {
      if (this_00->m_columnCount <= sourceIndex->c) goto LAB_00410b09;
      iVar4 = QConcatenateTablesProxyModelPrivate::computeRowsPrior
                        (*(QConcatenateTablesProxyModelPrivate **)(this + 8),m);
      iVar1 = sourceIndex->c;
      qVar2 = sourceIndex->i;
      __return_storage_ptr__->r = iVar4 + sourceIndex->r;
      __return_storage_ptr__->c = iVar1;
      __return_storage_ptr__->i = qVar2;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)this;
    }
    else {
      local_50.context.version = 2;
      local_50.context.function._4_4_ = 0;
      local_50.context._4_8_ = 0;
      local_50.context._12_8_ = 0;
      local_50.context.category = "default";
      QMessageLogger::warning
                (&local_50,
                 "QConcatenateTablesProxyModel: index from wrong model passed to mapFromSource");
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  else {
LAB_00410b09:
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QConcatenateTablesProxyModel::mapFromSource(const QModelIndex &sourceIndex) const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (!sourceIndex.isValid())
        return QModelIndex();
    const QAbstractItemModel *sourceModel = sourceIndex.model();
    if (!d->containsSourceModel(sourceModel)) {
        qWarning("QConcatenateTablesProxyModel: index from wrong model passed to mapFromSource");
        Q_ASSERT(!"QConcatenateTablesProxyModel: index from wrong model passed to mapFromSource");
        return QModelIndex();
    }
    if (sourceIndex.column() >= d->m_columnCount)
        return QModelIndex();
    int rowsPrior = d_func()->computeRowsPrior(sourceModel);
    return createIndex(rowsPrior + sourceIndex.row(), sourceIndex.column(), sourceIndex.internalPointer());
}